

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

void __thiscall minibag::Recorder::stopWriting(Recorder *this)

{
  Level LVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *__old;
  char *__new;
  bool enabled;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  if ((((byte)miniros::console::g_initialized ^ 0xff) & 1) != 0) {
    miniros::console::initialize();
  }
  if (((stopWriting::loc.initialized_ ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    miniros::console::initializeLogLocation(&stopWriting::loc,local_28,Info);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  if (stopWriting::loc.level_ != Info) {
    miniros::console::setLogLocationLevel(&stopWriting::loc,Info);
    miniros::console::checkLogLocationEnabled(&stopWriting::loc);
  }
  pvVar2 = stopWriting::loc.logger_;
  LVar1 = stopWriting::loc.level_;
  if ((stopWriting::loc.logger_enabled_ & 1U) != 0) {
    uVar3 = std::__cxx11::string::c_str();
    miniros::console::print
              ((FilterBase *)0x0,pvVar2,LVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
               ,0x171,"void minibag::Recorder::stopWriting()","Closing %s.",uVar3);
  }
  minibag::Bag::close();
  __old = (char *)std::__cxx11::string::c_str();
  __new = (char *)std::__cxx11::string::c_str();
  rename(__old,__new);
  return;
}

Assistant:

void Recorder::stopWriting()
{
  MINIROS_INFO("Closing %s.", target_filename_.c_str());
  bag_.close();
  rename(write_filename_.c_str(), target_filename_.c_str());
}